

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

void __thiscall QByteArray::QByteArray(QByteArray *this,qsizetype size,Initialization param_3)

{
  long lVar1;
  char *pcVar2;
  undefined4 in_EDX;
  QArrayDataPointer<char> *in_RSI;
  QArrayDataPointer<char> *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffb0;
  QArrayDataPointer<char> *n;
  qsizetype in_stack_ffffffffffffffc8;
  QArrayDataPointer<char> *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  n = in_RDI;
  QArrayDataPointer<char>::QArrayDataPointer(in_RDI);
  if ((long)in_RSI < 1) {
    QArrayDataPointer<char>::fromRawData((char *)in_RSI,CONCAT44(in_EDX,in_stack_ffffffffffffffb0));
    QArrayDataPointer<char>::operator=
              (in_RSI,(QArrayDataPointer<char> *)CONCAT44(in_EDX,in_stack_ffffffffffffffb0));
    QArrayDataPointer<char>::~QArrayDataPointer
              ((QArrayDataPointer<char> *)CONCAT44(in_EDX,in_stack_ffffffffffffffb0));
  }
  else {
    QArrayDataPointer<char>::QArrayDataPointer
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(qsizetype)n,
               (AllocationOption)((ulong)in_RSI >> 0x20));
    QArrayDataPointer<char>::operator=
              (in_RSI,(QArrayDataPointer<char> *)CONCAT44(in_EDX,in_stack_ffffffffffffffb0));
    QArrayDataPointer<char>::~QArrayDataPointer
              ((QArrayDataPointer<char> *)CONCAT44(in_EDX,in_stack_ffffffffffffffb0));
    qt_noop();
    pcVar2 = QArrayDataPointer<char>::data(in_RDI);
    pcVar2[(long)in_RSI] = '\0';
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray::QByteArray(qsizetype size, Qt::Initialization)
{
    if (size <= 0) {
        d = DataPointer::fromRawData(&_empty, 0);
    } else {
        d = DataPointer(size, size);
        Q_CHECK_PTR(d.data());
        d.data()[size] = '\0';
    }
}